

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

float __thiscall lda::powf(lda *this,float __x,float __y)

{
  lda_math_mode lVar1;
  ostream *poVar2;
  float fVar3;
  
  lVar1 = this->mmode;
  if (lVar1 == USE_SIMD) {
    fVar3 = ldamath::fastlog2(__x);
    fVar3 = ldamath::fastpow2(fVar3 * __y);
    return fVar3;
  }
  if (lVar1 != USE_PRECISE) {
    if (lVar1 == USE_FAST_APPROX) {
      fVar3 = ldamath::fastpow(__x,__y);
      return fVar3;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "lda::powf: Trampled or invalid math mode, aborting");
    std::endl<char,std::char_traits<char>>(poVar2);
    abort();
  }
  fVar3 = ::powf(__x,__y);
  return fVar3;
}

Assistant:

float lda::powf(float x, float p)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      // std::cerr << "lda::powf FAST_APPROX ";
      return ldamath::powf<float, USE_FAST_APPROX>(x, p);
    case USE_PRECISE:
      // std::cerr << "lda::powf PRECISE ";
      return ldamath::powf<float, USE_PRECISE>(x, p);
    case USE_SIMD:
      // std::cerr << "lda::powf SIMD ";
      return ldamath::powf<float, USE_SIMD>(x, p);
    default:
      std::cerr << "lda::powf: Trampled or invalid math mode, aborting" << std::endl;
      abort();
      return 0.0f;
  }
}